

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

void __thiscall pstore::file::deleter_base::~deleter_base(deleter_base *this)

{
  deleter_base *this_local;
  
  ~deleter_base(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

deleter_base::~deleter_base () noexcept {
            no_ex_escape ([this] () { this->unlink (); });
        }